

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

uint64_t LD_GenHashSeed(int index)

{
  int iVar1;
  uint64_t uVar2;
  uint64_t y;
  uint64_t x;
  
  if (LD_seed == 0) {
    iVar1 = rand();
    LD_seed = (uint64_t)iVar1;
  }
  y = (long)index + LD_seed;
  LD_mangle((uchar *)&y,(uchar *)&x,8);
  uVar2 = LD_AwareHash((uchar *)&y,8,0x172a550d,0x172a554f,0x46253dc2);
  return uVar2;
}

Assistant:

uint64_t LD_GenHashSeed(int index) {
	/*
	if (index == 0) {
		srand(0);
	}
	*/
	if (LD_seed == 0) {
		LD_seed = rand();
	}
	uint64_t x, y = LD_seed + index;
	LD_mangle((const unsigned char*)&y, (unsigned char*)&x, 8);
	return LD_AwareHash((uint8_t*)&y, 8, 388650253, 388650319, 1176845762);
}